

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O2

char * int2str::impl::detail<10000ull>::convert_step<char*>(number_t x,char *iter)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  
  if (x < 10000) {
    *iter = '0';
    pcVar2 = detail<1000ull>::convert_step<char*>(x,iter + 1);
    return pcVar2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = x;
  *iter = SUB161(auVar1 / ZEXT816(10000),0) + '0';
  pcVar2 = detail<1000ull>::convert_step<char*>
                     (SUB168(auVar1 / ZEXT816(10000),0) * -10000 + x,iter + 1);
  return pcVar2;
}

Assistant:

inline static Iter convert_step(number_t x, Iter iter)
    {
        if (N > x)
        {
            *iter++ = '0';
            return detail<N / 10u>::convert_step(x, iter);
        }
        auto const w = x / N;
        *iter++ = static_cast<char>('0' + w);
        return detail<N / 10u>::convert_step(x - w * N, iter);
    }